

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

void __thiscall tcmalloc::PageHeap::Delete(PageHeap *this,Span *span)

{
  SpinLockHolder local_20;
  SpinLockHolder h;
  Span *span_local;
  PageHeap *this_local;
  
  h.lock_ = (SpinLock *)span;
  SpinLockHolder::SpinLockHolder(&local_20,&this->lock_);
  DeleteLocked(this,(Span *)h.lock_);
  SpinLockHolder::~SpinLockHolder(&local_20);
  return;
}

Assistant:

void PageHeap::Delete(Span* span) {
  SpinLockHolder h(&lock_);
  DeleteLocked(span);
}